

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

InternalParseResult * __thiscall
Catch::Clara::Parser::parse(Parser *this,string *exeName,TokenStream *tokens)

{
  ParserBase *pPVar1;
  StringRef rhs;
  StringRef lhs;
  bool bVar2;
  int iVar3;
  ParseResultType PVar4;
  ParseState *pPVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string *message;
  string *in_RDX;
  long in_RSI;
  InternalParseResult *in_RDI;
  ParserInfo *parseInfo;
  iterator __end3;
  iterator __begin3;
  vector<ParserInfo,_std::allocator<ParserInfo>_> *__range3;
  bool tokenParsed;
  BasicResult<Catch::Clara::Detail::ParseState> result;
  Arg *arg;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_> *__range2_1;
  Opt *opt;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_> *__range2;
  vector<ParserInfo,_std::allocator<ParserInfo>_> parseInfos;
  BasicResult<Catch::Clara::Detail::ParseState> *in_stack_fffffffffffffca8;
  BasicResult<Catch::Clara::Detail::ParseState> *in_stack_fffffffffffffcb0;
  char *in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcc0;
  ParseResultType in_stack_fffffffffffffcc4;
  size_type in_stack_fffffffffffffcd8;
  undefined7 in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffce7;
  string *in_stack_fffffffffffffd00;
  ParseState *in_stack_fffffffffffffd08;
  char *in_stack_fffffffffffffd10;
  char *in_stack_fffffffffffffd18;
  string local_268 [36];
  undefined4 local_244;
  undefined1 local_240 [40];
  undefined1 local_218 [96];
  reference local_1b8;
  ParserInfo *local_1b0;
  __normal_iterator<ParserInfo_*,_std::vector<ParserInfo,_std::allocator<ParserInfo>_>_> local_1a8;
  undefined1 *local_1a0;
  byte local_191;
  BasicResult local_138 [144];
  reference local_a8;
  undefined8 local_a0;
  reference local_98;
  Arg *local_90;
  __normal_iterator<const_Catch::Clara::Arg_*,_std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>_>
  local_88;
  long local_80;
  reference local_78;
  undefined8 local_70;
  reference local_68;
  Opt *local_60;
  __normal_iterator<const_Catch::Clara::Opt_*,_std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>_>
  local_58;
  long local_50;
  undefined1 local_38 [32];
  string *local_18;
  
  local_18 = in_RDX;
  std::vector<ParserInfo,_std::allocator<ParserInfo>_>::vector
            ((vector<ParserInfo,_std::allocator<ParserInfo>_> *)0x188257);
  std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::size
            ((vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_> *)(in_RSI + 0x30));
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::size
            ((vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_> *)(in_RSI + 0x48));
  std::vector<ParserInfo,_std::allocator<ParserInfo>_>::reserve
            ((vector<ParserInfo,_std::allocator<ParserInfo>_> *)
             CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),in_stack_fffffffffffffcd8
            );
  local_50 = in_RSI + 0x30;
  local_58._M_current =
       (Opt *)std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::begin
                        ((vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_> *)
                         in_stack_fffffffffffffca8);
  local_60 = (Opt *)std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::end
                              ((vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_> *)
                               in_stack_fffffffffffffca8);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Catch::Clara::Opt_*,_std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>_>
                             *)in_stack_fffffffffffffcb0,
                            (__normal_iterator<const_Catch::Clara::Opt_*,_std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>_>
                             *)in_stack_fffffffffffffca8), bVar2) {
    local_78 = __gnu_cxx::
               __normal_iterator<const_Catch::Clara::Opt_*,_std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>_>
               ::operator*(&local_58);
    local_70 = 0;
    local_68 = local_78;
    std::vector<ParserInfo,_std::allocator<ParserInfo>_>::push_back
              ((vector<ParserInfo,_std::allocator<ParserInfo>_> *)in_stack_fffffffffffffcb0,
               (value_type *)in_stack_fffffffffffffca8);
    __gnu_cxx::
    __normal_iterator<const_Catch::Clara::Opt_*,_std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>_>
    ::operator++(&local_58);
  }
  local_80 = in_RSI + 0x48;
  local_88._M_current =
       (Arg *)std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::begin
                        ((vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_> *)
                         in_stack_fffffffffffffca8);
  local_90 = (Arg *)std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::end
                              ((vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_> *)
                               in_stack_fffffffffffffca8);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Catch::Clara::Arg_*,_std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>_>
                             *)in_stack_fffffffffffffcb0,
                            (__normal_iterator<const_Catch::Clara::Arg_*,_std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>_>
                             *)in_stack_fffffffffffffca8), bVar2) {
    local_a8 = __gnu_cxx::
               __normal_iterator<const_Catch::Clara::Arg_*,_std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>_>
               ::operator*(&local_88);
    local_a0 = 0;
    local_98 = local_a8;
    std::vector<ParserInfo,_std::allocator<ParserInfo>_>::push_back
              ((vector<ParserInfo,_std::allocator<ParserInfo>_> *)in_stack_fffffffffffffcb0,
               (value_type *)in_stack_fffffffffffffca8);
    __gnu_cxx::
    __normal_iterator<const_Catch::Clara::Arg_*,_std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>_>
    ::operator++(&local_88);
  }
  ExeName::set((ExeName *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  Detail::BasicResult<Catch::Clara::ParseResultType>::~BasicResult
            ((BasicResult<Catch::Clara::ParseResultType> *)in_stack_fffffffffffffcb0);
  Detail::TokenStream::TokenStream
            ((TokenStream *)in_stack_fffffffffffffcb0,(TokenStream *)in_stack_fffffffffffffca8);
  Detail::ParseState::ParseState
            ((ParseState *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
             (ParseResultType)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
             (TokenStream *)in_stack_fffffffffffffcb0);
  Detail::BasicResult<Catch::Clara::Detail::ParseState>::ok<Catch::Clara::Detail::ParseState>
            ((ParseState *)in_stack_fffffffffffffca8);
  Detail::ParseState::~ParseState((ParseState *)0x1884a5);
  Detail::TokenStream::~TokenStream((TokenStream *)0x1884b2);
  do {
    pPVar5 = Detail::ResultValueBase<Catch::Clara::Detail::ParseState>::value
                       (&in_stack_fffffffffffffcb0->
                         super_ResultValueBase<Catch::Clara::Detail::ParseState>);
    Detail::ParseState::remainingTokens(pPVar5);
    bVar2 = Detail::TokenStream::operator_cast_to_bool((TokenStream *)in_stack_fffffffffffffcb0);
    if (!bVar2) {
      Detail::BasicResult<Catch::Clara::Detail::ParseState>::BasicResult
                (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
      goto LAB_0018893d;
    }
    local_191 = 0;
    local_1a0 = local_38;
    local_1a8._M_current =
         (ParserInfo *)
         std::vector<ParserInfo,_std::allocator<ParserInfo>_>::begin
                   ((vector<ParserInfo,_std::allocator<ParserInfo>_> *)in_stack_fffffffffffffca8);
    local_1b0 = (ParserInfo *)
                std::vector<ParserInfo,_std::allocator<ParserInfo>_>::end
                          ((vector<ParserInfo,_std::allocator<ParserInfo>_> *)
                           in_stack_fffffffffffffca8);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<ParserInfo_*,_std::vector<ParserInfo,_std::allocator<ParserInfo>_>_>
                               *)in_stack_fffffffffffffcb0,
                              (__normal_iterator<ParserInfo_*,_std::vector<ParserInfo,_std::allocator<ParserInfo>_>_>
                               *)in_stack_fffffffffffffca8), bVar2) {
      local_1b8 = __gnu_cxx::
                  __normal_iterator<ParserInfo_*,_std::vector<ParserInfo,_std::allocator<ParserInfo>_>_>
                  ::operator*(&local_1a8);
      iVar3 = (*local_1b8->parser->_vptr_ParserBase[4])();
      if (CONCAT44(extraout_var,iVar3) == 0) {
LAB_001885d8:
        pPVar1 = local_1b8->parser;
        in_stack_fffffffffffffd00 = local_18;
        in_stack_fffffffffffffd08 =
             Detail::ResultValueBase<Catch::Clara::Detail::ParseState>::value
                       (&in_stack_fffffffffffffcb0->
                         super_ResultValueBase<Catch::Clara::Detail::ParseState>);
        Detail::ParseState::remainingTokens(in_stack_fffffffffffffd08);
        Detail::TokenStream::TokenStream
                  ((TokenStream *)in_stack_fffffffffffffcb0,(TokenStream *)in_stack_fffffffffffffca8
                  );
        (*pPVar1->_vptr_ParserBase[3])(local_218,pPVar1,in_stack_fffffffffffffd00,local_240);
        Detail::BasicResult<Catch::Clara::Detail::ParseState>::operator=
                  (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
        Detail::BasicResult<Catch::Clara::Detail::ParseState>::~BasicResult
                  (in_stack_fffffffffffffcb0);
        Detail::TokenStream::~TokenStream((TokenStream *)0x188684);
        bVar2 = Detail::BasicResult::operator_cast_to_bool(local_138);
        if (!bVar2) {
          Detail::BasicResult<Catch::Clara::Detail::ParseState>::BasicResult
                    (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
          goto LAB_0018893d;
        }
        pPVar5 = Detail::ResultValueBase<Catch::Clara::Detail::ParseState>::value
                           (&in_stack_fffffffffffffcb0->
                             super_ResultValueBase<Catch::Clara::Detail::ParseState>);
        PVar4 = Detail::ParseState::type(pPVar5);
        if (PVar4 != NoMatch) {
          local_191 = 1;
          local_1b8->count = local_1b8->count + 1;
          break;
        }
      }
      else {
        in_stack_fffffffffffffd10 = (char *)local_1b8->count;
        iVar3 = (*local_1b8->parser->_vptr_ParserBase[4])();
        in_stack_fffffffffffffd18 = (char *)CONCAT44(extraout_var_00,iVar3);
        if (in_stack_fffffffffffffd10 < in_stack_fffffffffffffd18) goto LAB_001885d8;
      }
      __gnu_cxx::
      __normal_iterator<ParserInfo_*,_std::vector<ParserInfo,_std::allocator<ParserInfo>_>_>::
      operator++(&local_1a8);
    }
    pPVar5 = Detail::ResultValueBase<Catch::Clara::Detail::ParseState>::value
                       (&in_stack_fffffffffffffcb0->
                         super_ResultValueBase<Catch::Clara::Detail::ParseState>);
    in_stack_fffffffffffffcc4 = Detail::ParseState::type(pPVar5);
    if (in_stack_fffffffffffffcc4 == ShortCircuitAll) {
      Detail::BasicResult<Catch::Clara::Detail::ParseState>::BasicResult
                (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
      goto LAB_0018893d;
    }
    if ((local_191 & 1) == 0) {
      StringRef::StringRef
                ((StringRef *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                 in_stack_fffffffffffffcb8);
      pPVar5 = Detail::ResultValueBase<Catch::Clara::Detail::ParseState>::value
                         (&in_stack_fffffffffffffcb0->
                           super_ResultValueBase<Catch::Clara::Detail::ParseState>);
      in_stack_fffffffffffffcb0 =
           (BasicResult<Catch::Clara::Detail::ParseState> *)
           Detail::ParseState::remainingTokens(pPVar5);
      message = (string *)Detail::TokenStream::operator->((TokenStream *)0x18887d);
      lhs.m_size = (size_type)in_stack_fffffffffffffd18;
      lhs.m_start = in_stack_fffffffffffffd10;
      rhs.m_size = (size_type)in_stack_fffffffffffffd08;
      rhs.m_start = (char *)in_stack_fffffffffffffd00;
      operator+[abi_cxx11_(lhs,rhs);
      Detail::BasicResult<Catch::Clara::Detail::ParseState>::runtimeError(message);
      std::__cxx11::string::~string(local_268);
LAB_0018893d:
      local_244 = 1;
      Detail::BasicResult<Catch::Clara::Detail::ParseState>::~BasicResult(in_stack_fffffffffffffcb0)
      ;
      std::vector<ParserInfo,_std::allocator<ParserInfo>_>::~vector
                ((vector<ParserInfo,_std::allocator<ParserInfo>_> *)
                 CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
      return in_RDI;
    }
  } while( true );
}

Assistant:

Detail::InternalParseResult
        Parser::parse( std::string const& exeName,
                       Detail::TokenStream tokens ) const {

            struct ParserInfo {
                ParserBase const* parser = nullptr;
                size_t count = 0;
            };
            std::vector<ParserInfo> parseInfos;
            parseInfos.reserve( m_options.size() + m_args.size() );
            for ( auto const& opt : m_options ) {
                parseInfos.push_back( { &opt, 0 } );
            }
            for ( auto const& arg : m_args ) {
                parseInfos.push_back( { &arg, 0 } );
            }

            m_exeName.set( exeName );

            auto result = Detail::InternalParseResult::ok(
                Detail::ParseState( ParseResultType::NoMatch, CATCH_MOVE(tokens) ) );
            while ( result.value().remainingTokens() ) {
                bool tokenParsed = false;

                for ( auto& parseInfo : parseInfos ) {
                    if ( parseInfo.parser->cardinality() == 0 ||
                         parseInfo.count < parseInfo.parser->cardinality() ) {
                        result = parseInfo.parser->parse(
                            exeName, CATCH_MOVE(result).value().remainingTokens() );
                        if ( !result )
                            return result;
                        if ( result.value().type() !=
                             ParseResultType::NoMatch ) {
                            tokenParsed = true;
                            ++parseInfo.count;
                            break;
                        }
                    }
                }

                if ( result.value().type() == ParseResultType::ShortCircuitAll )
                    return result;
                if ( !tokenParsed )
                    return Detail::InternalParseResult::runtimeError(
                        "Unrecognised token: " +
                        result.value().remainingTokens()->token );
            }
            // !TBD Check missing required options
            return result;
        }